

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# environment_navxythetalat.cpp
# Opt level: O1

int __thiscall
EnvironmentNAVXYTHETALAT::GetTrueCost(EnvironmentNAVXYTHETALAT *this,int parentID,int childID)

{
  pointer ppEVar1;
  EnvNAVXYTHETALATHashEntry_t *pEVar2;
  EnvNAVXYTHETALATHashEntry_t *pEVar3;
  EnvNAVXYTHETALATAction_t *pEVar4;
  bool bVar5;
  bool bVar6;
  int iVar7;
  int iVar8;
  code *pcVar9;
  int *piVar10;
  long lVar11;
  SBPL_Exception *this_00;
  long lVar12;
  long *plVar13;
  uint uVar14;
  long lVar15;
  uint uVar16;
  int local_48;
  
  iVar7 = (this->super_EnvironmentNAVXYTHETALATTICE).EnvNAVXYTHETALATCfg.actionwidth;
  bVar5 = 0 < iVar7;
  if (0 < iVar7) {
    ppEVar1 = (this->StateID2CoordTable).
              super__Vector_base<EnvNAVXYTHETALATHashEntry_t_*,_std::allocator<EnvNAVXYTHETALATHashEntry_t_*>_>
              ._M_impl.super__Vector_impl_data._M_start;
    pEVar2 = ppEVar1[childID];
    pEVar3 = ppEVar1[parentID];
    lVar12 = 0;
    lVar15 = 0;
    do {
      pEVar4 = (this->super_EnvironmentNAVXYTHETALATTICE).EnvNAVXYTHETALATCfg.ActionsV
               [(uint)(int)pEVar3->Theta];
      uVar16 = (int)(&pEVar4->dX)[lVar12] + pEVar3->X;
      uVar14 = (int)(&pEVar4->dY)[lVar12] + pEVar3->Y;
      iVar7 = (*(this->super_EnvironmentNAVXYTHETALATTICE).super_DiscreteSpaceInformation.
                _vptr_DiscreteSpaceInformation[0x24])
                        (this,(ulong)(uint)(int)(&pEVar4->endtheta)[lVar12]);
      iVar8 = (*(this->super_EnvironmentNAVXYTHETALATTICE).super_DiscreteSpaceInformation.
                _vptr_DiscreteSpaceInformation[0x41])(this,(ulong)uVar16,(ulong)uVar14);
      bVar6 = true;
      if ((char)iVar8 != '\0') {
        pcVar9 = (code *)this->GetHashEntry;
        plVar13 = (long *)((long)&(this->super_EnvironmentNAVXYTHETALATTICE).
                                  super_DiscreteSpaceInformation._vptr_DiscreteSpaceInformation +
                          *(long *)&this->field_0x1c8);
        if (((ulong)pcVar9 & 1) != 0) {
          pcVar9 = *(code **)(pcVar9 + *plVar13 + -1);
        }
        piVar10 = (int *)(*pcVar9)(plVar13,uVar16,uVar14,iVar7);
        if (piVar10 == (int *)0x0) {
          bVar6 = true;
        }
        else {
          bVar6 = true;
          if (*piVar10 == pEVar2->stateID) {
            local_48 = (*(this->super_EnvironmentNAVXYTHETALATTICE).super_DiscreteSpaceInformation.
                         _vptr_DiscreteSpaceInformation[0x36])
                                 (this,(ulong)(uint)pEVar3->X,(ulong)(uint)pEVar3->Y,
                                  (ulong)(uint)(int)pEVar3->Theta,&pEVar4->aind + lVar12);
            if (999999999 < local_48) {
              local_48 = -1;
            }
            bVar6 = false;
          }
        }
      }
      if (!bVar6) break;
      lVar15 = lVar15 + 1;
      lVar11 = (long)(this->super_EnvironmentNAVXYTHETALATTICE).EnvNAVXYTHETALATCfg.actionwidth;
      lVar12 = lVar12 + 0x68;
      bVar5 = lVar15 < lVar11;
    } while (lVar15 < lVar11);
  }
  if (!bVar5) {
    this_00 = (SBPL_Exception *)__cxa_allocate_exception(0x10);
    SBPL_Exception::SBPL_Exception
              (this_00,
               "This should never happen! we didn\'t find the state we need to get the true cost for!"
              );
    __cxa_throw(this_00,&SBPL_Exception::typeinfo,std::runtime_error::~runtime_error);
  }
  return local_48;
}

Assistant:

int EnvironmentNAVXYTHETALAT::GetTrueCost(int parentID, int childID)
{
    EnvNAVXYTHETALATHashEntry_t* fromHash = StateID2CoordTable[parentID];
    EnvNAVXYTHETALATHashEntry_t* toHash = StateID2CoordTable[childID];

    for (int i = 0; i < EnvNAVXYTHETALATCfg.actionwidth; i++) {
        EnvNAVXYTHETALATAction_t* nav3daction = &EnvNAVXYTHETALATCfg.ActionsV[(unsigned int)fromHash->Theta][i];
        int newX = fromHash->X + nav3daction->dX;
        int newY = fromHash->Y + nav3daction->dY;
        int newTheta = normalizeDiscAngle(nav3daction->endtheta);

        // skip the invalid cells
        if (!IsValidCell(newX, newY)) {
            continue;
        }

        EnvNAVXYTHETALATHashEntry_t* hash;
        if ((hash = (this->*GetHashEntry)(newX, newY, newTheta)) == NULL) {
            continue;
        }
        if (hash->stateID != toHash->stateID) {
            continue;
        }

        // get cost
        int cost = GetActionCost(fromHash->X, fromHash->Y, fromHash->Theta, nav3daction);

        if (cost >= INFINITECOST) {
            return -1;
        }
        return cost;
    }
    throw SBPL_Exception("This should never happen! we didn't find the state we need to get the true cost for!");
    return -1;
}